

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

short tcu::(anonymous_namespace)::convertSat<short,int>(int src)

{
  short sVar1;
  int max;
  int min;
  int src_local;
  
  min._2_2_ = std::numeric_limits<short>::min();
  sVar1 = std::numeric_limits<short>::max();
  if ((min._2_2_ <= src) && (min._2_2_ = sVar1, src <= sVar1)) {
    min._2_2_ = (short)src;
  }
  return min._2_2_;
}

Assistant:

static inline T convertSat (S src)
{
	S min = (S)std::numeric_limits<T>::min();
	S max = (S)std::numeric_limits<T>::max();

	if (src < min)
		return (T)min;
	else if (src > max)
		return (T)max;
	else
		return (T)src;
}